

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TraverseSchema.cpp
# Opt level: O0

XMLCh * __thiscall
xercesc_4_0::TraverseSchema::traverseNotationDecl
          (TraverseSchema *this,DOMElement *elem,XMLCh *name,XMLCh *uriStr)

{
  SchemaInfo *pSVar1;
  bool bVar2;
  int iVar3;
  uint namespaceURI;
  Grammar *pGVar4;
  SchemaInfo *this_00;
  DOMElement *elem_00;
  XMLCh *notationName;
  DOMElement *notationElem;
  SchemaInfo *impInfo;
  Grammar *grammar;
  uint uriId_1;
  SchemaInfo *saveInfo;
  undefined1 local_40 [4];
  uint uriId;
  NamespaceScopeManager nsMgr;
  XMLCh *uriStr_local;
  XMLCh *name_local;
  DOMElement *elem_local;
  TraverseSchema *this_local;
  
  nsMgr.fSchemaInfo = (SchemaInfo *)uriStr;
  NamespaceScopeManager::NamespaceScopeManager
            ((NamespaceScopeManager *)local_40,elem,this->fSchemaInfo,this);
  iVar3 = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                    (this->fURIStringPool,nsMgr.fSchemaInfo);
  pSVar1 = this->fSchemaInfo;
  if (this->fTargetNSURI == iVar3) {
LAB_0043ae30:
    elem_00 = SchemaInfo::getTopLevelComponent
                        (this->fSchemaInfo,6,(XMLCh *)SchemaSymbols::fgELT_NOTATION,name,
                         &this->fSchemaInfo);
    if (elem_00 == (DOMElement *)0x0) {
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x81,(XMLCh *)nsMgr.fSchemaInfo,
                        name,(XMLCh *)0x0,(XMLCh *)0x0);
      this_local = (TraverseSchema *)0x0;
    }
    else {
      this_local = (TraverseSchema *)traverseNotationDecl(this,elem_00);
      this->fSchemaInfo = pSVar1;
      iVar3 = SchemaInfo::getTargetNSURI(this->fSchemaInfo);
      this->fTargetNSURI = iVar3;
    }
  }
  else {
    namespaceURI = (*(this->fURIStringPool->super_XSerializable)._vptr_XSerializable[5])
                             (this->fURIStringPool,nsMgr.fSchemaInfo);
    bVar2 = isImportingNS(this,namespaceURI);
    if (!bVar2) {
      reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x8e,(XMLCh *)nsMgr.fSchemaInfo,
                        (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      this_local = (TraverseSchema *)0x0;
      goto LAB_0043af2a;
    }
    pGVar4 = GrammarResolver::getGrammar(this->fGrammarResolver,(XMLCh *)nsMgr.fSchemaInfo);
    if (pGVar4 != (Grammar *)0x0) {
      iVar3 = (*(pGVar4->super_XSerializable)._vptr_XSerializable[5])();
      if (iVar3 == 1) {
        this_00 = SchemaInfo::getImportInfo(this->fSchemaInfo,namespaceURI);
        if (this_00 != (SchemaInfo *)0x0) {
          bVar2 = SchemaInfo::getProcessed(this_00);
          if (!bVar2) {
            this->fSchemaInfo = this_00;
            iVar3 = SchemaInfo::getTargetNSURI(this->fSchemaInfo);
            this->fTargetNSURI = iVar3;
            goto LAB_0043ae30;
          }
        }
        reportSchemaError(this,elem,(XMLCh *)XMLUni::fgXMLErrDomain,0x28,(XMLCh *)nsMgr.fSchemaInfo,
                          name,(XMLCh *)0x0,(XMLCh *)0x0);
        this_local = (TraverseSchema *)0x0;
        goto LAB_0043af2a;
      }
    }
    reportSchemaError(this,elem,(XMLCh *)XMLUni::fgValidityDomain,0x26,(XMLCh *)nsMgr.fSchemaInfo,
                      (XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    this_local = (TraverseSchema *)0x0;
  }
LAB_0043af2a:
  NamespaceScopeManager::~NamespaceScopeManager((NamespaceScopeManager *)local_40);
  return (XMLCh *)this_local;
}

Assistant:

const XMLCh* TraverseSchema::traverseNotationDecl(const DOMElement* const elem,
                                                  const XMLCh* const name,
                                                  const XMLCh* const uriStr) {

    NamespaceScopeManager nsMgr(elem, fSchemaInfo, this);

    unsigned int uriId = fURIStringPool->addOrFind(uriStr);
    SchemaInfo*  saveInfo = fSchemaInfo;

    if (fTargetNSURI != (int) uriId) {

        // Make sure that we have an explicit import statement.
        // Clause 4 of Schema Representation Constraint:
        // http://www.w3.org/TR/xmlschema-1/#src-resolve
        unsigned int uriId = fURIStringPool->addOrFind(uriStr);

        if (!isImportingNS(uriId)) {

            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::InvalidNSReference, uriStr);
            return 0;
        }

        Grammar* grammar = fGrammarResolver->getGrammar(uriStr);

        if (grammar == 0 || grammar->getGrammarType() != Grammar::SchemaGrammarType) {

            reportSchemaError(elem, XMLUni::fgValidityDomain, XMLValid::GrammarNotFound, uriStr);
            return 0;
        }

        SchemaInfo* impInfo = fSchemaInfo->getImportInfo(uriId);

        if (!impInfo || impInfo->getProcessed()) {

            reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::TypeNotFound, uriStr, name);
            return 0;
        }

        fSchemaInfo = impInfo;
        fTargetNSURI = fSchemaInfo->getTargetNSURI();
    }

    DOMElement* notationElem = fSchemaInfo->getTopLevelComponent(SchemaInfo::C_Notation,
        SchemaSymbols::fgELT_NOTATION, name, &fSchemaInfo);

    if (notationElem == 0) {

        reportSchemaError(elem, XMLUni::fgXMLErrDomain, XMLErrs::Notation_DeclNotFound, uriStr, name);
        return 0;
    }

    const XMLCh* notationName = traverseNotationDecl(notationElem);

    fSchemaInfo = saveInfo;
    fTargetNSURI = fSchemaInfo->getTargetNSURI();

    return notationName;
}